

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

string * __thiscall
Kernel::getQuantifiedStr_abi_cxx11_
          (string *__return_storage_ptr__,Kernel *this,Unit *u,List<unsigned_int> *nonQuantified)

{
  Unit *pUVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  size_t i;
  long lVar6;
  uint uVar7;
  undefined1 in_R9B;
  Formula *pFVar8;
  bool dummy;
  string res;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> t_map;
  TermVarIterator vit;
  bool local_1d9;
  Formula *local_1d8;
  Clause *local_1d0;
  string local_1c8;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  string *local_188;
  _func_int **local_180;
  undefined1 local_178 [32];
  Set<unsigned_int,_Lib::DefaultHash> local_158;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_130;
  undefined1 local_108 [216];
  
  local_158._capacity = 0;
  local_158._nonemptyCells = 0;
  local_158._size = 0;
  local_158._entries = (Cell *)0x0;
  local_188 = __return_storage_ptr__;
  ::Lib::Set<unsigned_int,_Lib::DefaultHash>::expand
            ((Set<unsigned_int,_Lib::DefaultHash> *)(local_178 + 0x20));
  local_1a8 = &local_198;
  local_1a0 = 0;
  local_198 = 0;
  local_130._timestamp = 1;
  local_130._size = 0;
  local_130._deleted = 0;
  local_130._capacityIndex = 0;
  local_130._capacity = 0;
  local_130._20_8_ = 0;
  local_130._28_8_ = 0;
  local_130._afterLast._4_4_ = 0;
  SortHelper::collectVariableSorts((Unit *)this,&local_130);
  if (((byte)this[4] & 1) == 0) {
    local_1d8 = *(Formula **)(this + 0x38);
    local_1d0 = (Clause *)this;
    if (((ulong)local_1d8 & 0xfffff) != 0) {
      local_1d8 = (Formula *)(ulong)((uint)local_1d8 & 0xfffff);
      pFVar8 = (Formula *)0x0;
      local_180 = (_func_int **)&PTR__TermVarIterator_00b69778;
      do {
        TermVarIterator::TermVarIterator
                  ((TermVarIterator *)local_108,&local_1d0->_literals[(long)pFVar8]->super_Term);
        while (bVar3 = TermVarIterator::hasNext((TermVarIterator *)local_108), bVar3) {
          uVar4 = TermVarIterator::next((TermVarIterator *)local_108);
          bVar3 = u != (Unit *)0x0;
          if (u != (Unit *)0x0) {
            uVar7 = u->_number;
            pUVar1 = u;
            while (uVar7 != uVar4) {
              pUVar1 = *(Unit **)&pUVar1->_inference;
              bVar3 = pUVar1 != (Unit *)0x0;
              if (pUVar1 == (Unit *)0x0) break;
              uVar7 = pUVar1->_number;
            }
          }
          if (!bVar3) {
            local_1c8._M_dataplus._M_p._0_4_ = uVar4;
            uVar7 = 0x811c9dc5;
            lVar6 = 0;
            do {
              uVar7 = (*(byte *)((long)&local_1c8._M_dataplus._M_p + lVar6) ^ uVar7) * 0x1000193;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            ::Lib::Set<unsigned_int,Lib::DefaultHash>::
            rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                      ((Set<unsigned_int,Lib::DefaultHash> *)(local_178 + 0x20),
                       (anon_class_8_1_ba1d8281)&local_1c8,uVar7,(anon_class_8_1_ba1d8281)&local_1c8
                       ,&local_1d9);
          }
        }
        local_108._0_8_ = local_180;
        if ((TermList **)local_108._24_8_ != (TermList **)0x0) {
          uVar5 = local_108._16_8_ * 8 + 0xfU & 0xfffffffffffffff0;
          if (uVar5 == 0) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_108._24_8_;
          }
          else if (uVar5 < 0x11) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_108._24_8_;
          }
          else if (uVar5 < 0x19) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_108._24_8_;
          }
          else if (uVar5 < 0x21) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_108._24_8_;
          }
          else if (uVar5 < 0x31) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_108._24_8_;
          }
          else if (uVar5 < 0x41) {
            *(undefined8 *)local_108._24_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_108._24_8_;
          }
          else {
            operator_delete((void *)local_108._24_8_,0x10);
          }
        }
        pFVar8 = (Formula *)((long)&pFVar8->_connective + 1);
      } while (pFVar8 != local_1d8);
    }
    Clause::literalsOnlyToString_abi_cxx11_((string *)local_108,local_1d0);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_108);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  else {
    local_1d8 = *(Formula **)(this + 0x38);
    FormulaVarIterator::FormulaVarIterator((FormulaVarIterator *)local_108,local_1d8);
    while (bVar3 = FormulaVarIterator::hasNext((FormulaVarIterator *)local_108), bVar3) {
      uVar4 = FormulaVarIterator::next((FormulaVarIterator *)local_108);
      bVar3 = u != (Unit *)0x0;
      if (u != (Unit *)0x0) {
        uVar7 = u->_number;
        pUVar1 = u;
        while (uVar7 != uVar4) {
          pUVar1 = *(Unit **)&pUVar1->_inference;
          bVar3 = pUVar1 != (Unit *)0x0;
          if (pUVar1 == (Unit *)0x0) break;
          uVar7 = pUVar1->_number;
        }
      }
      if (!bVar3) {
        local_1c8._M_dataplus._M_p._0_4_ = uVar4;
        uVar7 = 0x811c9dc5;
        lVar6 = 0;
        do {
          uVar7 = (*(byte *)((long)&local_1c8._M_dataplus._M_p + lVar6) ^ uVar7) * 0x1000193;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        ::Lib::Set<unsigned_int,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<unsigned_int,Lib::DefaultHash> *)(local_178 + 0x20),
                   (anon_class_8_1_ba1d8281)&local_1c8,uVar7,(anon_class_8_1_ba1d8281)&local_1c8,
                   &local_1d9);
      }
    }
    Formula::toString_abi_cxx11_(&local_1c8,local_1d8);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._M_dataplus._M_p._4_4_,(uint)local_1c8._M_dataplus._M_p) !=
        &local_1c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8._M_dataplus._M_p._4_4_,(uint)local_1c8._M_dataplus._M_p),
                      local_1c8.field_2._M_allocated_capacity + 1);
    }
    FormulaVarIterator::~FormulaVarIterator((FormulaVarIterator *)local_108);
  }
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_178,local_1a8,local_1a8 + local_1a0);
  psVar2 = local_188;
  getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
            (local_188,(Kernel *)(local_178 + 0x20),(Set<unsigned_int,_Lib::DefaultHash> *)local_178
             ,(string *)&local_130,
             (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x1,
             (bool)in_R9B);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)((long)(uint *)local_178._16_8_ + 1));
  }
  ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_130);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  if (local_158._entries != (Cell *)0x0) {
    uVar5 = (long)local_158._capacity * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_158._entries;
    }
    else if (uVar5 < 0x11) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_158._entries;
    }
    else if (uVar5 < 0x19) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_158._entries;
    }
    else if (uVar5 < 0x21) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_158._entries;
    }
    else if (uVar5 < 0x31) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_158._entries;
    }
    else if (uVar5 < 0x41) {
      (local_158._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (local_158._entries)->value = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_158._entries;
    }
    else {
      operator_delete(local_158._entries,0x10);
    }
  }
  return psVar2;
}

Assistant:

std::string getQuantifiedStr(Unit* u, List<unsigned>* nonQuantified=0)
{
  Set<unsigned> vars;
  std::string res;
  DHMap<unsigned,TermList> t_map;
  SortHelper::collectVariableSorts(u,t_map);
  if (u->isClause()) {
    Clause* cl=static_cast<Clause*>(u);
    unsigned clen=cl->length();
    for(unsigned i=0;i<clen;i++) {
      TermVarIterator vit( (*cl)[i] ); //TODO update iterator for two var lits?
      while(vit.hasNext()) {
        unsigned var=vit.next();
        if (List<unsigned>::member(var, nonQuantified)) {
          continue;
        }
        vars.insert(var);
      }
    }
    res=cl->literalsOnlyToString();
  } else {
    Formula* formula=static_cast<FormulaUnit*>(u)->formula();
    FormulaVarIterator fvit( formula );
    while(fvit.hasNext()) {
      unsigned var=fvit.next();
      if (List<unsigned>::member(var, nonQuantified)) {
        continue;
      }
      vars.insert(var);
    }
    res=formula->toString();
  }

  return getQuantifiedStr(vars, res, t_map);
}